

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen.cpp
# Opt level: O2

void Omega_h::filter_coarsen_candidates
               (LOs *cands2edges,Read<signed_char> *cand_codes,Reals *cand_quals)

{
  Write<int> WStack_108;
  LOs new2old;
  Write<double> local_e8;
  Write<int> local_d8;
  Write<double> local_c8;
  Write<signed_char> local_b8;
  Write<int> local_a8;
  Write<signed_char> local_98;
  Write<int> local_88;
  Write<int> local_78;
  Write<int> local_68;
  Write<signed_char> local_58;
  Bytes keep;
  Write<signed_char> local_38;
  
  Write<signed_char>::Write(&local_38,&cand_codes->write_);
  each_neq_to<signed_char>((Omega_h *)&keep,(Read<signed_char> *)&local_38,'\0');
  Write<signed_char>::~Write(&local_38);
  Write<signed_char>::Write(&local_58,&keep.write_);
  collect_marked((Omega_h *)&new2old,(Read<signed_char> *)&local_58);
  Write<signed_char>::~Write(&local_58);
  Write<int>::Write(&local_78,&new2old.write_);
  Write<int>::Write(&local_88,&cands2edges->write_);
  unmap<int>((Omega_h *)&local_68,(LOs *)&local_78,(Read<int> *)&local_88,1);
  Read<int>::Read((Read<signed_char> *)&WStack_108,&local_68);
  Write<int>::operator=(&cands2edges->write_,&WStack_108);
  Write<int>::~Write(&WStack_108);
  Write<int>::~Write(&local_68);
  Write<int>::~Write(&local_88);
  Write<int>::~Write(&local_78);
  Write<int>::Write(&local_a8,&new2old.write_);
  Write<signed_char>::Write(&local_b8,&cand_codes->write_);
  unmap<signed_char>((Omega_h *)&local_98,(LOs *)&local_a8,(Read<signed_char> *)&local_b8,1);
  Read<signed_char>::Read((Read<signed_char> *)&WStack_108,&local_98);
  Write<signed_char>::operator=(&cand_codes->write_,(Write<signed_char> *)&WStack_108);
  Write<signed_char>::~Write((Write<signed_char> *)&WStack_108);
  Write<signed_char>::~Write(&local_98);
  Write<signed_char>::~Write(&local_b8);
  Write<int>::~Write(&local_a8);
  if (cand_quals != (Reals *)0x0) {
    Write<int>::Write(&local_d8,&new2old.write_);
    Write<double>::Write(&local_e8,&cand_quals->write_);
    unmap<double>((Omega_h *)&local_c8,(LOs *)&local_d8,(Read<signed_char> *)&local_e8,2);
    Read<double>::Read((Read<signed_char> *)&WStack_108,&local_c8);
    Write<double>::operator=(&cand_quals->write_,(Write<signed_char> *)&WStack_108);
    Write<double>::~Write((Write<double> *)&WStack_108);
    Write<double>::~Write(&local_c8);
    Write<double>::~Write(&local_e8);
    Write<int>::~Write(&local_d8);
  }
  Write<int>::~Write(&new2old.write_);
  Write<signed_char>::~Write(&keep.write_);
  return;
}

Assistant:

static void filter_coarsen_candidates(
    LOs* cands2edges, Read<I8>* cand_codes, Reals* cand_quals = nullptr) {
  auto keep = each_neq_to(*cand_codes, I8(DONT_COLLAPSE));
  auto new2old = collect_marked(keep);
  *cands2edges = unmap(new2old, *cands2edges, 1);
  *cand_codes = unmap(new2old, *cand_codes, 1);
  if (cand_quals) *cand_quals = unmap(new2old, *cand_quals, 2);
}